

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpuid.c
# Opt level: O0

int todigit(variant_char c)

{
  int iVar1;
  char in_DIL;
  undefined4 local_4;
  
  iVar1 = ossl_ctype_check((int)in_DIL,4);
  if (iVar1 == 0) {
    iVar1 = ossl_ctype_check((int)in_DIL,0x10);
    if (iVar1 == 0) {
      local_4 = 0x10;
    }
    else {
      local_4 = ossl_tolower(0);
      local_4 = local_4 + -0x57;
    }
  }
  else {
    local_4 = in_DIL + -0x30;
  }
  return local_4;
}

Assistant:

static int todigit(variant_char c)
{
    if (ossl_isdigit(c))
        return c - '0';
    else if (ossl_isxdigit(c))
        return ossl_tolower(c) - 'a' + 10;

    /* return largest base value to make caller terminate the loop */
    return 16;
}